

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArenaTest.cpp
# Opt level: O0

void __thiscall Arena_GetMemoryUsage_Test::TestBody(Arena_GetMemoryUsage_Test *this)

{
  bool bVar1;
  char *pcVar2;
  size_t sVar3;
  char *in_R9;
  string local_b8;
  AssertHelper local_98;
  Message local_90;
  bool local_81;
  undefined1 local_80 [8];
  AssertionResult gtest_ar_;
  AssertHelper local_68;
  Message local_60;
  int local_58 [4];
  size_t local_48;
  undefined1 local_40 [8];
  AssertionResult gtest_ar;
  Arena arena;
  Arena_GetMemoryUsage_Test *this_local;
  
  memt::Arena::Arena((Arena *)&gtest_ar.message_);
  local_48 = memt::Arena::getMemoryUse((Arena *)&gtest_ar.message_);
  local_58[0] = 0;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_40,"arena.getMemoryUse()","0",&local_48,local_58);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_40);
  if (!bVar1) {
    testing::Message::Message(&local_60);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_40);
    testing::internal::AssertHelper::AssertHelper
              (&local_68,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Macaulay2[P]memtailor/src/test/ArenaTest.cpp"
               ,0x1d,pcVar2);
    testing::internal::AssertHelper::operator=(&local_68,&local_60);
    testing::internal::AssertHelper::~AssertHelper(&local_68);
    testing::Message::~Message(&local_60);
  }
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._5_3_ = 0;
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._4_1_ = !bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_40);
  if (gtest_ar_.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_4_ == 0) {
    memt::Arena::alloc((Arena *)&gtest_ar.message_,100);
    sVar3 = memt::Arena::getMemoryUse((Arena *)&gtest_ar.message_);
    local_81 = 99 < sVar3;
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_80,&local_81,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_80);
    if (!bVar1) {
      testing::Message::Message(&local_90);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_b8,(internal *)local_80,(AssertionResult *)"arena.getMemoryUse() >= 100",
                 "false","true",in_R9);
      pcVar2 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_98,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Macaulay2[P]memtailor/src/test/ArenaTest.cpp"
                 ,0x1f,pcVar2);
      testing::internal::AssertHelper::operator=(&local_98,&local_90);
      testing::internal::AssertHelper::~AssertHelper(&local_98);
      std::__cxx11::string::~string((string *)&local_b8);
      testing::Message::~Message(&local_90);
    }
    gtest_ar_.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._5_3_ = 0;
    gtest_ar_.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._4_1_ = !bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_80);
    if (gtest_ar_.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._4_4_ == 0) {
      gtest_ar_.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_4_ = 0;
    }
  }
  memt::Arena::~Arena((Arena *)&gtest_ar.message_);
  return;
}

Assistant:

TEST(Arena, GetMemoryUsage) {
  memt::Arena arena;
  ASSERT_EQ(arena.getMemoryUse(), 0);
  arena.alloc(100);
  ASSERT_TRUE(arena.getMemoryUse() >= 100);
}